

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyline.cpp
# Opt level: O1

ON_3dPoint * __thiscall
ON_Polyline::PointAt(ON_3dPoint *__return_storage_ptr__,ON_Polyline *this,double t)

{
  int iVar1;
  double dVar2;
  int iVar3;
  ON_3dPoint *pOVar4;
  ON_3dPoint local_50;
  ON_3dPoint local_38;
  
  iVar1 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count;
  if (iVar1 < 0) {
    pOVar4 = &ON_3dPoint::Origin;
  }
  else {
    if (iVar1 != 1) {
      dVar2 = floor(t);
      iVar3 = (int)dVar2;
      if (iVar3 < 0) {
        iVar3 = 0;
      }
      else if (iVar3 < iVar1 + -1) {
        t = t - (double)iVar3;
      }
      else {
        iVar3 = iVar1 + -2;
        t = 1.0;
      }
      ::operator*(&local_38,1.0 - t,
                  (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a + iVar3);
      ::operator*(&local_50,t,
                  (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a +
                  (long)iVar3 + 1);
      ON_3dPoint::operator+(__return_storage_ptr__,&local_38,&local_50);
      return __return_storage_ptr__;
    }
    pOVar4 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
  }
  __return_storage_ptr__->z = pOVar4->z;
  dVar2 = pOVar4->y;
  __return_storage_ptr__->x = pOVar4->x;
  __return_storage_ptr__->y = dVar2;
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_Polyline::PointAt( double t ) const
{
  const int count = m_count;
  int segment_index = 0;
  if ( count < 0 ) {
    return ON_3dPoint::Origin;
  }
  else if (count == 1 ) {
    return m_a[0];
  }
  else {
    segment_index = (int)floor(t);
    if ( segment_index < 0 ) {
      segment_index = 0;
      //t = 0.0;
    }
    else if ( segment_index >= count-1 ) {
      segment_index = count-2;
      t = 1.0;//Note: This is not correct if the input t is greater than count-1.  It needs to be adjusted.
    }
    else {
      t -= ((double)segment_index);
    }
  }

  return (1-t)*m_a[segment_index] + t*m_a[segment_index+1];
}